

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lha_read_data_lzh(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  uint16_t uVar1;
  wchar_t wVar2;
  void *pvVar3;
  lzh_stream *in_RCX;
  size_t *in_RDX;
  long *in_RSI;
  archive *in_RDI;
  wchar_t r;
  ssize_t bytes_avail;
  lha *lha;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  archive_read *in_stack_ffffffffffffffc8;
  long *method;
  wchar_t local_4;
  
  method = *(long **)in_RDI[0x15].archive_format_name;
  if (method[0x25] == 0) {
    method[0x26] = 0x10000;
    pvVar3 = malloc(method[0x26]);
    method[0x25] = (long)pvVar3;
    if (method[0x25] == 0) {
      archive_set_error(in_RDI,0xc,"No memory for lzh decompression");
      return L'\xffffffe2';
    }
  }
  if (*(char *)((long)method + 0x123) == '\0') {
    wVar2 = lzh_decode_init(in_RCX,(char *)method);
    if (wVar2 == L'\xffffffe7') {
      *in_RSI = 0;
      *in_RDX = 0;
      in_RCX->next_in = (uchar *)0x0;
      archive_set_error(in_RDI,0x54,"Unsupported lzh compression method -%c%c%c-",
                        (ulong)(uint)(int)*(char *)((long)method + 0x29),
                        (ulong)(uint)(int)*(char *)((long)method + 0x2a),
                        (ulong)(uint)(int)*(char *)((long)method + 0x2b));
      archive_read_format_lha_read_data_skip(in_stack_ffffffffffffffc8);
      return L'\xffffffec';
    }
    if (wVar2 != L'\0') {
      archive_set_error(in_RDI,0xc,"Couldn\'t allocate memory for lzh decompression");
      return L'\xffffffe2';
    }
    *(undefined1 *)((long)method + 0x123) = 1;
    method[0x33] = 0;
    method[0x34] = 0;
    in_stack_ffffffffffffffc0 = 0;
    in_stack_ffffffffffffffc4 = 0;
  }
  pvVar3 = __archive_read_ahead
                     ((archive_read *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      (ssize_t *)0x144092);
  method[0x2f] = (long)pvVar3;
  if ((long)in_stack_ffffffffffffffc8 < 1) {
    archive_set_error(in_RDI,0x54,"Truncated LHa file body");
    local_4 = L'\xffffffe2';
  }
  else {
    if (method[1] < (long)in_stack_ffffffffffffffc8) {
      in_stack_ffffffffffffffc8 = (archive_read *)method[1];
    }
    method[0x30] = (long)in_stack_ffffffffffffffc8;
    method[0x31] = 0;
    if (method[0x33] == 0) {
      method[0x32] = method[0x25];
      method[0x33] = method[0x26];
    }
    wVar2 = lzh_decode(in_RCX,(wchar_t)((ulong)method >> 0x20));
    if (wVar2 != L'\0') {
      if (wVar2 != L'\x01') {
        archive_set_error(in_RDI,-1,"Bad lzh data");
        return L'\xffffffe7';
      }
      *(undefined1 *)((long)method + 0x124) = 1;
    }
    method[2] = method[0x31];
    method[1] = method[1] - method[0x31];
    if ((method[0x33] == 0) || (*(char *)((long)method + 0x124) != '\0')) {
      in_RCX->next_in = (uchar *)*method;
      *in_RDX = method[0x32] - method[0x25];
      *in_RSI = method[0x25];
      uVar1 = lha_crc16(*(uint16_t *)(method + 3),(void *)*in_RSI,*in_RDX);
      *(uint16_t *)(method + 3) = uVar1;
      *method = *in_RDX + *method;
    }
    else {
      in_RCX->next_in = (uchar *)*method;
      *in_RDX = 0;
      *in_RSI = 0;
    }
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

static int
lha_read_data_lzh(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct lha *lha = (struct lha *)(a->format->data);
	ssize_t bytes_avail;
	int r;

	/* If the buffer hasn't been allocated, allocate it now. */
	if (lha->uncompressed_buffer == NULL) {
		lha->uncompressed_buffer_size = 64 * 1024;
		lha->uncompressed_buffer
		    = (unsigned char *)malloc(lha->uncompressed_buffer_size);
		if (lha->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for lzh decompression");
			return (ARCHIVE_FATAL);
		}
	}

	/* If we haven't yet read any data, initialize the decompressor. */
	if (!lha->decompress_init) {
		r = lzh_decode_init(&(lha->strm), lha->method);
		switch (r) {
		case ARCHIVE_OK:
			break;
		case ARCHIVE_FAILED:
        		/* Unsupported compression. */
			*buff = NULL;
			*size = 0;
			*offset = 0;
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Unsupported lzh compression method -%c%c%c-",
			    lha->method[0], lha->method[1], lha->method[2]);
			/* We know compressed size; just skip it. */
			archive_read_format_lha_read_data_skip(a);
			return (ARCHIVE_WARN);
		default:
			archive_set_error(&a->archive, ENOMEM,
			    "Couldn't allocate memory "
			    "for lzh decompression");
			return (ARCHIVE_FATAL);
		}
		/* We've initialized decompression for this stream. */
		lha->decompress_init = 1;
		lha->strm.avail_out = 0;
		lha->strm.total_out = 0;
	}

	/*
	 * Note: '1' here is a performance optimization.
	 * Recall that the decompression layer returns a count of
	 * available bytes; asking for more than that forces the
	 * decompressor to combine reads by copying data.
	 */
	lha->strm.next_in = __archive_read_ahead(a, 1, &bytes_avail);
	if (bytes_avail <= 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated LHa file body");
		return (ARCHIVE_FATAL);
	}
	if (bytes_avail > lha->entry_bytes_remaining)
		bytes_avail = (ssize_t)lha->entry_bytes_remaining;

	lha->strm.avail_in = bytes_avail;
	lha->strm.total_in = 0;
	if (lha->strm.avail_out == 0) {
		lha->strm.next_out = lha->uncompressed_buffer;
		lha->strm.avail_out = lha->uncompressed_buffer_size;
	}

	r = lzh_decode(&(lha->strm), bytes_avail == lha->entry_bytes_remaining);
	switch (r) {
	case ARCHIVE_OK:
		break;
	case ARCHIVE_EOF:
		lha->end_of_entry = 1;
		break;
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Bad lzh data");
		return (ARCHIVE_FAILED);
	}
	lha->entry_unconsumed = lha->strm.total_in;
	lha->entry_bytes_remaining -= lha->strm.total_in;

	if (lha->strm.avail_out == 0 || lha->end_of_entry) {
		*offset = lha->entry_offset;
		*size = lha->strm.next_out - lha->uncompressed_buffer;
		*buff = lha->uncompressed_buffer;
		lha->entry_crc_calculated =
		    lha_crc16(lha->entry_crc_calculated, *buff, *size);
		lha->entry_offset += *size;
	} else {
		*offset = lha->entry_offset;
		*size = 0;
		*buff = NULL;
	}
	return (ARCHIVE_OK);
}